

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_binary_func_op_cast_clustered
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          char *op,BaseType input_type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool forwarding;
  SPIRType *pSVar2;
  SPIRType *pSVar3;
  string expr;
  string cast_op0;
  SPIRType expected_type;
  string local_208;
  char *local_1e8;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  undefined1 local_180 [192];
  uint *local_c0;
  size_t local_b8;
  uint local_a8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_1e8 = op;
  pSVar2 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      result_type);
  SPIRType::SPIRType((SPIRType *)local_180,pSVar2);
  local_180._12_4_ = input_type;
  pSVar3 = Compiler::expression_type(&this->super_Compiler,op0);
  if (*(BaseType *)&(pSVar3->super_IVariant).field_0xc == input_type) {
    to_unpacked_expression_abi_cxx11_(&local_1a0,this,op0,true);
  }
  else {
    bitcast_glsl_abi_cxx11_(&local_1a0,this,(SPIRType *)local_180,op0);
  }
  paVar1 = &local_1e0.field_2;
  local_1e0._M_string_length = 0;
  local_1e0.field_2._M_local_buf[0] = '\0';
  local_1e0._M_dataplus._M_p = (pointer)paVar1;
  if (*(BaseType *)&(pSVar2->super_IVariant).field_0xc == input_type) {
    to_expression_abi_cxx11_(&local_1c0,this,op1,true);
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
              (&local_208,(spirv_cross *)&local_1e8,(char **)0x35c56f,(char (*) [2])&local_1a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35c44c,
               (char (*) [3])&local_1c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3452a8,
               (char (*) [2])CONCAT44(result_type,op1));
    ::std::__cxx11::string::_M_append((char *)&local_1e0,(ulong)local_208._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p);
    }
  }
  else {
    (*(this->super_Compiler)._vptr_Compiler[0x38])(&local_208,this,pSVar2,local_180);
    ::std::__cxx11::string::operator=((string *)&local_1e0,(string *)&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p);
    }
    ::std::__cxx11::string::push_back((char)&local_1e0);
    to_expression_abi_cxx11_(&local_1c0,this,op1,true);
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
              (&local_208,(spirv_cross *)&local_1e8,(char **)0x35c56f,(char (*) [2])&local_1a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35c44c,
               (char (*) [3])&local_1c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3452a8,
               (char (*) [2])CONCAT44(result_type,op1));
    ::std::__cxx11::string::_M_append((char *)&local_1e0,(ulong)local_208._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p);
    }
    ::std::__cxx11::string::push_back((char)&local_1e0);
  }
  forwarding = should_forward(this,op0);
  emit_op(this,result_type,result_id,&local_1e0,forwarding,false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  local_180._0_8_ = &PTR__SPIRType_003d5290;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  local_b8 = 0;
  if (local_c0 != local_a8) {
    free(local_c0);
  }
  local_180._144_8_ = 0;
  if ((TypedID<(spirv_cross::Types)1> *)local_180._136_8_ !=
      (TypedID<(spirv_cross::Types)1> *)(local_180 + 0xa0)) {
    free((void *)local_180._136_8_);
  }
  local_180._96_8_ = 0;
  if ((undefined1 *)local_180._88_8_ != local_180 + 0x70) {
    free((void *)local_180._88_8_);
  }
  local_180._40_8_ = 0;
  if ((undefined1 *)local_180._32_8_ != local_180 + 0x38) {
    free((void *)local_180._32_8_);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_binary_func_op_cast_clustered(uint32_t result_type, uint32_t result_id, uint32_t op0,
                                                      uint32_t op1, const char *op, SPIRType::BaseType input_type)
{
	// Special purpose method for implementing clustered subgroup opcodes.
	// Main difference is that op1 does not participate in any casting, it needs to be a literal.
	auto &out_type = get<SPIRType>(result_type);
	auto expected_type = out_type;
	expected_type.basetype = input_type;
	string cast_op0 =
	    expression_type(op0).basetype != input_type ? bitcast_glsl(expected_type, op0) : to_unpacked_expression(op0);

	string expr;
	if (out_type.basetype != input_type)
	{
		expr = bitcast_glsl_op(out_type, expected_type);
		expr += '(';
		expr += join(op, "(", cast_op0, ", ", to_expression(op1), ")");
		expr += ')';
	}
	else
	{
		expr += join(op, "(", cast_op0, ", ", to_expression(op1), ")");
	}

	emit_op(result_type, result_id, expr, should_forward(op0));
	inherit_expression_dependencies(result_id, op0);
}